

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

string_validator __thiscall
goodform::string_validator::match(string_validator *this,regex *expression)

{
  bool bVar1;
  allocator<char> local_51;
  string local_50;
  error_message local_30;
  
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    (this->value_,expression,0);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"STRING DOES NOT MATCH EXPRESSION",&local_51);
    error_message::error_message(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)this->error_,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return *this;
}

Assistant:

string_validator string_validator::match(std::regex expression)
  {
    if (!std::regex_match(this->value_, expression))
      this->error_ = error_message("STRING DOES NOT MATCH EXPRESSION");

    string_validator ret(*this);
    return ret;
  }